

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

nid_type __thiscall
AddrManImpl::GetEntry(AddrManImpl *this,bool use_tried,size_t bucket,size_t position)

{
  nid_type (*panVar1) [64];
  nid_type nVar2;
  undefined3 in_register_00000031;
  long in_FS_OFFSET;
  
  if (CONCAT31(in_register_00000031,use_tried) == 0) {
    nVar2 = -1;
    if (0x3ff < bucket || 0x3f < position) goto LAB_00442e83;
    panVar1 = this->vvNew;
  }
  else {
    nVar2 = -1;
    if (0xff < bucket || 0x3f < position) goto LAB_00442e83;
    panVar1 = this->vvTried;
  }
  nVar2 = panVar1[bucket][position];
LAB_00442e83:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return nVar2;
  }
  __stack_chk_fail();
}

Assistant:

nid_type AddrManImpl::GetEntry(bool use_tried, size_t bucket, size_t position) const
{
    AssertLockHeld(cs);

    if (use_tried) {
        if (Assume(position < ADDRMAN_BUCKET_SIZE) && Assume(bucket < ADDRMAN_TRIED_BUCKET_COUNT)) {
            return vvTried[bucket][position];
        }
    } else {
        if (Assume(position < ADDRMAN_BUCKET_SIZE) && Assume(bucket < ADDRMAN_NEW_BUCKET_COUNT)) {
            return vvNew[bucket][position];
        }
    }

    return -1;
}